

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdPrimvarReader_matrix *preader,string *warn,string *err,
               PrimReconstructOptions *options)

{
  char *pcVar1;
  size_type *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  _Rb_tree_header *p_Var4;
  size_type sVar5;
  undefined1 auVar6 [8];
  size_type sVar7;
  int iVar8;
  uint32_t uVar9;
  ostream *poVar10;
  undefined8 *puVar11;
  long *plVar12;
  const_iterator cVar13;
  mapped_type *pmVar14;
  _Base_ptr p_Var15;
  anon_struct_8_0_00000001_for___align *paVar16;
  long lVar17;
  Property *pPVar18;
  size_type __n;
  long *__n_00;
  string sVar19;
  undefined1 uVar20;
  size_t i;
  ulong uVar21;
  char cVar22;
  _Base_ptr p_Var23;
  double *pdVar24;
  string *__v;
  undefined8 uVar25;
  matrix4d *pmVar26;
  _Alloc_hider _Var27;
  Property *prop;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *target;
  long lVar28;
  anon_struct_8_0_00000001_for___align aVar29;
  _Base_ptr __k;
  storage_t<double> sVar30;
  pointer pcVar31;
  bool bVar32;
  bool bVar33;
  byte bVar34;
  ParseResult ret;
  string attr_type_name;
  ParseResult ret_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  optional<tinyusdz::value::matrix4d> pv;
  Animatable<tinyusdz::value::matrix4d> dst;
  optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>_> av;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff868;
  bool local_789;
  undefined1 local_788 [8];
  long *local_780;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_778;
  Property *local_760;
  UsdPrimvarReader_matrix *local_758;
  string *local_750;
  AttrMetas *local_748;
  string local_740;
  AttrMetas *local_720;
  _Base_ptr local_718;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *local_710;
  _Base_ptr local_708;
  string local_700;
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [128];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_650;
  undefined1 local_620 [8];
  undefined1 local_618 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_608 [7];
  undefined1 local_598 [8];
  undefined1 local_590 [128];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  long *local_4f0;
  undefined8 local_4e8;
  long local_4e0;
  undefined1 local_4d8;
  undefined1 local_4d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4c8;
  undefined1 auStack_4c0 [16];
  undefined8 uStack_4b0;
  _Alloc_hider local_4a8;
  size_type local_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_498;
  storage_union sStack_488;
  vtable_type *local_478;
  undefined8 uStack_470;
  pointer local_468;
  pointer pSStack_460;
  pointer local_458;
  undefined2 local_450;
  storage_t<double> local_448;
  undefined1 uStack_440;
  undefined7 uStack_43f;
  undefined1 uStack_438;
  undefined7 uStack_437;
  bool bStack_430;
  undefined8 local_358;
  undefined8 local_350;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_348;
  undefined1 local_340 [32];
  long local_320 [2];
  string local_310 [16];
  undefined8 local_300 [2];
  undefined1 local_2f0 [32];
  key_type local_2d0;
  undefined1 local_2b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  undefined1 local_290 [40];
  storage_union sStack_268;
  undefined1 local_258 [40];
  ios_base aiStack_230 [8];
  bool local_228;
  storage_t<double> local_220;
  _Alloc_hider local_218;
  undefined1 local_210 [32];
  undefined1 local_1f0 [40];
  undefined1 local_1c8 [16];
  undefined1 auStack_1b8 [32];
  undefined1 local_198 [40];
  undefined1 auStack_170 [16];
  undefined1 local_160 [40];
  undefined1 local_138 [40];
  undefined1 local_110 [24];
  undefined1 auStack_f8 [56];
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_c0;
  undefined1 local_a0 [24];
  undefined1 auStack_88 [8];
  undefined1 local_80 [32];
  storage_t<tinyusdz::Token> local_60;
  undefined1 uStack_40;
  undefined8 uStack_3f;
  
  bVar34 = 0;
  local_650._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_650._M_impl.super__Rb_tree_header._M_header;
  local_650._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_650._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_650._M_impl.super__Rb_tree_header._M_node_count = 0;
  prop = (Property *)warn;
  target = (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)err;
  local_758 = preader;
  local_650._M_impl.super__Rb_tree_header._M_header._M_right =
       local_650._M_impl.super__Rb_tree_header._M_header._M_left;
  local_2b0._0_8_ = &local_2a0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"info:id","");
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_650,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._0_8_ != &local_2a0) {
    operator_delete((void *)local_2b0._0_8_,local_2a0._M_allocated_capacity + 1);
  }
  p_Var15 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var23 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_789 = p_Var15 == p_Var23;
  if (!local_789) {
    local_748 = &(local_758->fallback)._metas;
    local_340._8_8_ = &(local_758->fallback)._paths;
    local_350 = &(local_758->fallback)._attrib;
    local_710 = (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)&local_758->varname;
    local_720 = &(local_758->result)._metas;
    local_358 = &(local_758->result)._actual_type_name;
    local_348 = &(local_758->super_ShaderNode).super_UsdShadePrim.props;
    local_750 = err;
    local_718 = p_Var23;
    local_340._0_8_ = warn;
    do {
      local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_510,*(long *)(p_Var15 + 1),
                 (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
      local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_740,"inputs:fallback","");
      sVar7 = local_510._M_string_length;
      sVar5 = local_740._M_string_length;
      local_780 = (long *)(local_778._M_local_buf + 8);
      local_778._M_allocated_capacity = 0;
      local_778._M_local_buf[8] = '\0';
      __n = local_510._M_string_length;
      if (local_740._M_string_length < local_510._M_string_length) {
        __n = local_740._M_string_length;
      }
      if (__n == 0) {
        bVar32 = true;
      }
      else {
        iVar8 = bcmp(local_510._M_dataplus._M_p,local_740._M_dataplus._M_p,__n);
        bVar32 = iVar8 == 0;
      }
      local_760 = (Property *)(p_Var15 + 2);
      if ((bool)(bVar32 ^ 1U | sVar7 != sVar5)) {
        local_788._0_4_ = 1;
      }
      else {
        if (((ulong)p_Var15[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
          local_788._0_4_ = 7;
          local_6e0._0_8_ = &DAT_0000003e;
          local_4d0 = (undefined1  [8])auStack_4c0;
          local_4d0 = (undefined1  [8])
                      ::std::__cxx11::string::_M_create((ulong *)local_4d0,(ulong)local_6e0);
          auStack_4c0._0_8_ = local_6e0._0_8_;
          builtin_strncpy((char *)local_4d0,
                          "Property `{}` must be Attribute, but declared as Relationship.",0x3e);
          local_4c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_6e0._0_8_;
          *(char *)((long)local_4d0 + local_6e0._0_8_) = '\0';
          fmt::format<std::__cxx11::string>
                    ((string *)local_2b0,(fmt *)local_4d0,&local_740,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_6e0._0_8_);
          ::std::__cxx11::string::operator=((string *)&local_780,(string *)local_2b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._0_8_ != &local_2a0) {
            operator_delete((void *)local_2b0._0_8_,local_2a0._M_allocated_capacity + 1);
          }
          if (local_4d0 != (undefined1  [8])auStack_4c0) {
            operator_delete((void *)local_4d0,(ulong)(auStack_4c0._0_8_ + 1));
          }
        }
        if (p_Var15[6]._M_left != p_Var15[6]._M_parent) {
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_340._8_8_,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var15[6]._M_parent);
          local_788 = (undefined1  [8])((ulong)local_788 & 0xffffffff00000000);
        }
        Attribute::type_name_abi_cxx11_(&local_700,&local_760->_attrib);
        local_2b0._0_8_ = &local_2a0;
        local_2a0._M_allocated_capacity = 0x643478697274616d;
        local_2b0._8_8_ = 8;
        local_2a0._M_local_buf[8] = '\0';
        if (local_700._M_string_length == 8) {
          bVar32 = *(long *)local_700._M_dataplus._M_p == 0x643478697274616d;
        }
        else {
          bVar32 = false;
        }
        bVar33 = true;
        if (!bVar32) {
          local_4f0 = &local_4e0;
          local_4e0 = 0x643478697274616d;
          local_4e8 = 8;
          local_4d8 = 0;
          if (local_700._M_string_length == 8) {
            bVar33 = *(long *)local_700._M_dataplus._M_p == 0x643478697274616d;
          }
          else {
            bVar33 = false;
          }
        }
        if ((!bVar32) && (local_4f0 != &local_4e0)) {
          operator_delete(local_4f0,local_4e0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._0_8_ != &local_2a0) {
          operator_delete((void *)local_2b0._0_8_,local_2a0._M_allocated_capacity + 1);
        }
        if (bVar33) {
          iVar8 = *(int *)((long)&p_Var15[0x17]._M_parent + 4);
          if (iVar8 != 1) {
            if (iVar8 == 0) {
              (local_758->fallback)._value_empty = true;
              AttrMetas::operator=(local_748,(AttrMetas *)(p_Var15 + 7));
              __v = &local_740;
LAB_00257cda:
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_650,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__v);
              local_788 = (undefined1  [8])((ulong)local_788 & 0xffffffff00000000);
            }
            else {
              prop = (Property *)0x25;
              ::std::__cxx11::string::_M_replace
                        ((ulong)&local_780,0,(char *)local_778._M_allocated_capacity,0x3f9856);
              local_788._0_4_ = 8;
            }
            goto LAB_00257ce7;
          }
          if (p_Var15[5]._M_left == p_Var15[5]._M_parent) {
            if (p_Var15[4]._M_right == (_Base_ptr)0x0) {
              bVar32 = false;
            }
            else {
              iVar8 = (**(code **)p_Var15[4]._M_right)();
              bVar32 = iVar8 == 4;
            }
            if ((bVar32) || ((p_Var15[5]._M_color & _S_black) != _S_red)) {
              (local_758->fallback)._blocked = true;
            }
          }
          if (((char)p_Var15[5]._M_color == _S_red) &&
             ((((p_Var15[4]._M_right != (_Base_ptr)0x0 &&
                (iVar8 = (**(code **)p_Var15[4]._M_right)(), iVar8 == 0)) ||
               ((p_Var15[4]._M_right != (_Base_ptr)0x0 &&
                (iVar8 = (**(code **)p_Var15[4]._M_right)(), iVar8 == 1)))) &&
              (p_Var15[5]._M_left == p_Var15[5]._M_parent)))) {
            bVar32 = true;
            bVar33 = false;
          }
          else {
            local_4d0 = (undefined1  [8])0x3ff0000000000000;
            auStack_4c0._8_8_ = 0;
            uStack_4b0._0_4_ = Varying;
            uStack_4b0._4_1_ = false;
            uStack_4b0._5_3_ = 0;
            local_4c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            auStack_4c0._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_4a8._M_p = (pointer)0x3ff0000000000000;
            aStack_498._8_8_ = 0;
            sStack_488.dynamic = (void *)0x0;
            local_4a0 = 0;
            aStack_498._M_allocated_capacity = 0;
            sStack_488._8_8_ = 0x3ff0000000000000;
            local_468 = (pointer)0x0;
            pSStack_460 = (pointer)0x0;
            local_478 = (vtable_type *)0x0;
            uStack_470._0_1_ = false;
            uStack_470._1_7_ = 0;
            local_458 = (pointer)0x3ff0000000000000;
            local_450._0_1_ = false;
            local_450._1_1_ = 0;
            uStack_438 = 0;
            uStack_437 = 0;
            bStack_430 = false;
            local_448 = (storage_t<double>)0x0;
            uStack_440 = 0;
            uStack_43f = 0;
            bVar32 = primvar::PrimVar::is_valid((PrimVar *)&p_Var15[4]._M_parent);
            if (bVar32) {
              if (((char)p_Var15[5]._M_color == _S_red) &&
                 (((p_Var15[4]._M_right != (_Base_ptr)0x0 &&
                   (iVar8 = (**(code **)p_Var15[4]._M_right)(), iVar8 == 0)) ||
                  ((p_Var15[4]._M_right != (_Base_ptr)0x0 &&
                   (iVar8 = (**(code **)p_Var15[4]._M_right)(), iVar8 == 1)))))) {
                sVar19 = (string)0x0;
              }
              else {
                primvar::PrimVar::get_value<tinyusdz::value::matrix4d>
                          ((optional<tinyusdz::value::matrix4d> *)local_620,
                           (PrimVar *)&p_Var15[4]._M_parent);
                sVar19 = local_620[0];
                if (local_620[0] == (string)0x1) {
                  memcpy(local_598 + 7,local_618,0x80);
                  memcpy(local_4d0,local_598 + 7,0x80);
                  local_450._0_1_ = true;
                  local_450._1_1_ = 0;
                }
              }
              if (p_Var15[5]._M_left == p_Var15[5]._M_parent) {
                if (sVar19 == (string)0x0) goto LAB_00257b45;
              }
              else {
                lVar28 = 0;
                uVar21 = 0;
                do {
                  if ((char)p_Var15[6]._M_color == _S_black) {
                    tinyusdz::value::TimeSamples::update((TimeSamples *)&p_Var15[5]._M_parent);
                  }
                  p_Var23 = p_Var15[5]._M_parent;
                  if (*(char *)((long)&p_Var23[1]._M_color + lVar28) == '\x01') {
                    TypedTimeSamples<tinyusdz::value::matrix4d>::add_blocked_sample
                              ((TypedTimeSamples<tinyusdz::value::matrix4d> *)&local_448,
                               *(double *)((long)&p_Var23->_M_color + lVar28));
                  }
                  else {
                    tinyusdz::value::Value::get_value<tinyusdz::value::matrix4d>
                              ((optional<tinyusdz::value::matrix4d> *)local_598,
                               (Value *)((long)&p_Var23->_M_parent + lVar28),false);
                    sVar19 = local_598[0];
                    local_620[0] = local_598[0];
                    if (local_598[0] == (string)0x1) {
                      pdVar24 = (double *)(local_598 + 8);
                      pmVar26 = (matrix4d *)local_618;
                      for (lVar17 = 0x10; lVar17 != 0; lVar17 = lVar17 + -1) {
                        pmVar26->m[0][0] = *pdVar24;
                        pdVar24 = pdVar24 + (ulong)bVar34 * -2 + 1;
                        pmVar26 = (matrix4d *)((long)pmVar26 + ((ulong)bVar34 * -2 + 1) * 8);
                      }
                      TypedTimeSamples<tinyusdz::value::matrix4d>::add_sample
                                ((TypedTimeSamples<tinyusdz::value::matrix4d> *)&local_448,
                                 *(double *)((long)&p_Var23->_M_color + lVar28),
                                 (matrix4d *)local_618);
                    }
                    else {
                      memset(local_6e0 + 7,0,0x88);
                    }
                    if (sVar19 == (string)0x0) goto LAB_00257b5c;
                  }
                  uVar21 = uVar21 + 1;
                  lVar28 = lVar28 + 0x28;
                } while (uVar21 < (ulong)(((long)p_Var15[5]._M_left - (long)p_Var15[5]._M_parent >>
                                          3) * -0x3333333333333333));
              }
              memcpy(local_6e0 + 7,local_4d0,0x82);
              sVar30 = local_448;
              pcVar31 = (pointer)CONCAT71(uStack_43f,uStack_440);
              aVar29._1_7_ = uStack_437;
              aVar29._0_1_ = uStack_438;
              local_448 = (storage_t<double>)0x0;
              uStack_440 = 0;
              uStack_43f = 0;
              uStack_438 = 0;
              uStack_437 = 0;
              cVar22 = '\x01';
              uVar20 = bStack_430;
            }
            else {
LAB_00257b45:
              memset(local_6e0 + 7,0,0x88);
LAB_00257b5c:
              sVar30 = (storage_t<double>)0x0;
              pcVar31 = (pointer)0x0;
              aVar29 = (anon_struct_8_0_00000001_for___align)0x0;
              uVar20 = 0;
              cVar22 = '\0';
            }
            if (local_448 != (storage_t<double>)0x0) {
              operator_delete((void *)local_448,CONCAT71(uStack_437,uStack_438) - (long)local_448);
            }
            local_2b0[0] = cVar22;
            if (cVar22 != '\0') {
              memcpy(local_2b0 + 8,local_6e0 + 7,0x82);
              local_210[8] = uVar20;
              local_220 = sVar30;
              local_218._M_p = pcVar31;
              local_210._0_8_ = aVar29;
            }
            p_Var23 = local_718;
            err = local_750;
            uVar20 = local_2b0[0];
            if ((stringstream)local_2b0[0] == (stringstream)0x1) {
              nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>>::
              operator=((optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>> *)local_350,
                        (Animatable<tinyusdz::value::matrix4d> *)(local_2b0 + 8));
            }
            else {
              local_788._0_4_ = 8;
              prop = (Property *)0x55;
              ::std::__cxx11::string::_M_replace
                        ((ulong)&local_780,0,(char *)local_778._M_allocated_capacity,0x3f9b24);
            }
            if (((stringstream)local_2b0[0] == (stringstream)0x1) &&
               (local_220 != (storage_t<double>)0x0)) {
              operator_delete((void *)local_220,local_210._0_8_ - (long)local_220);
            }
            if ((stringstream)uVar20 != (stringstream)0x0) {
              AttrMetas::operator=(local_748,(AttrMetas *)(p_Var15 + 7));
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_650,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_740);
              local_788 = (undefined1  [8])((ulong)local_788 & 0xffffffff00000000);
            }
            bVar33 = true;
            bVar32 = false;
          }
          if (bVar32) {
            if (p_Var15[6]._M_left != p_Var15[6]._M_parent) {
              AttrMetas::operator=(local_748,(AttrMetas *)(p_Var15 + 7));
              __v = (string *)&local_510;
              goto LAB_00257cda;
            }
            goto LAB_00257ce7;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_700._M_dataplus._M_p != &local_700.field_2) {
            operator_delete(local_700._M_dataplus._M_p,local_700.field_2._M_allocated_capacity + 1);
          }
          if ((bVar33) || (local_780 == (long *)(local_778._M_local_buf + 8))) goto LAB_00257d0c;
          uVar25 = CONCAT71(local_778._9_7_,local_778._M_local_buf[8]);
          _Var27._M_p = (pointer)local_780;
        }
        else {
          local_788._0_4_ = 3;
          ::std::__cxx11::stringstream::stringstream((stringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2a0._M_local_buf,"Property type mismatch. ",0x18);
          poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2a0._M_local_buf,local_740._M_dataplus._M_p,
                               local_740._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," expects type `",0xf);
          auStack_4c0._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               0x643478697274616d;
          local_4c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8;
          auStack_4c0._8_8_ = auStack_4c0._8_8_ & 0xffffffffffffff00;
          local_4d0 = (undefined1  [8])auStack_4c0;
          poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,auStack_4c0,8);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,"` but defined as type `",0x17);
          poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,local_700._M_dataplus._M_p,local_700._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"`",1);
          if (local_4d0 != (undefined1  [8])auStack_4c0) {
            operator_delete((void *)local_4d0,(ulong)(auStack_4c0._0_8_ + 1));
          }
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::operator=((string *)&local_780,(string *)local_4d0);
          if (local_4d0 != (undefined1  [8])auStack_4c0) {
            operator_delete((void *)local_4d0,(ulong)(auStack_4c0._0_8_ + 1));
          }
          ::std::__cxx11::stringstream::~stringstream((stringstream *)local_2b0);
          ::std::ios_base::~ios_base(aiStack_230);
LAB_00257ce7:
          uVar25 = local_700.field_2._M_allocated_capacity;
          _Var27._M_p = local_700._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_700._M_dataplus._M_p == &local_700.field_2) goto LAB_00257d0c;
        }
        operator_delete(_Var27._M_p,uVar25 + 1);
      }
LAB_00257d0c:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_740._M_dataplus._M_p != &local_740.field_2) {
        operator_delete(local_740._M_dataplus._M_p,local_740.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_510._M_dataplus._M_p != &local_510.field_2) {
        operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
      }
      iVar8 = 0;
      if (((ulong)local_788 & 0xfffffffd) == 0) {
        iVar8 = 3;
LAB_00257fad:
        bVar32 = false;
      }
      else {
        bVar32 = true;
        if (local_788._0_4_ != 1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,"ReconstructShader",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
          poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2b0,0x120a);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
          local_6e0._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6d0;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_6e0,"Parsing attribute `{}` failed. Error: {}","");
          fmt::format<char[16],std::__cxx11::string>
                    ((string *)local_4d0,(fmt *)local_6e0,(string *)"inputs:fallback",
                     (char (*) [16])&local_780,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prop);
          poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b0,(char *)local_4d0,(long)local_4c8);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
          if (local_4d0 != (undefined1  [8])auStack_4c0) {
            operator_delete((void *)local_4d0,(ulong)(auStack_4c0._0_8_ + 1));
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6e0._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6d0) {
            operator_delete((void *)local_6e0._0_8_,(ulong)(local_6d0._0_8_ + 1));
          }
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            puVar11 = (undefined8 *)
                      ::std::__cxx11::string::_M_append(local_6e0,(ulong)(err->_M_dataplus)._M_p);
            pcVar1 = (char *)(puVar11 + 2);
            if ((char *)*puVar11 == pcVar1) {
              auStack_4c0._0_8_ = *(undefined8 *)pcVar1;
              auStack_4c0._8_8_ = puVar11[3];
              local_4d0 = (undefined1  [8])auStack_4c0;
            }
            else {
              auStack_4c0._0_8_ = *(undefined8 *)pcVar1;
              local_4d0 = (undefined1  [8])*puVar11;
            }
            local_4c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        puVar11[1];
            *puVar11 = pcVar1;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)err,(string *)local_4d0);
            if (local_4d0 != (undefined1  [8])auStack_4c0) {
              operator_delete((void *)local_4d0,(ulong)(auStack_4c0._0_8_ + 1));
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6e0._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6d0) {
              operator_delete((void *)local_6e0._0_8_,(ulong)(local_6d0._0_8_ + 1));
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
          ::std::ios_base::~ios_base((ios_base *)(local_258 + 0x18));
          iVar8 = 1;
          goto LAB_00257fad;
        }
      }
      if (local_780 != (long *)(local_778._M_local_buf + 8)) {
        operator_delete(local_780,CONCAT71(local_778._9_7_,local_778._M_local_buf[8]) + 1);
      }
      if (bVar32) {
        local_708 = p_Var15 + 1;
        iVar8 = ::std::__cxx11::string::compare((char *)local_708);
        if (iVar8 == 0) {
          local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2d0,"inputs:varname","");
          cVar13 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&local_650,&local_2d0);
          bVar32 = (_Rb_tree_header *)cVar13._M_node == &local_650._M_impl.super__Rb_tree_header;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
            operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar32 = false;
        }
        if (bVar32) {
          local_2b0._0_8_ = ((ulong)local_2b0._0_8_ >> 8 & 0xffffff) << 8;
          local_2b0._8_8_ = ((ulong)local_2b0._8_8_ >> 8 & 0xffffff) << 8;
          local_2a0._M_allocated_capacity = local_2a0._M_allocated_capacity & 0xffffffffffff0000;
          local_2a0._M_local_buf[8] = '\0';
          local_220 = (storage_t<double>)0x0;
          local_218._M_p = local_218._M_p & 0xffffffffffffff00;
          local_110._16_8_ = 0;
          auStack_f8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_110._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_110._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          auStack_f8._16_4_ = 0;
          auStack_f8._24_8_ = 0;
          sStack_268._8_1_ = false;
          local_290._32_8_ = 0;
          sStack_268.dynamic = (void *)0x0;
          local_290._16_8_ = 0;
          local_290._24_8_ = 0;
          local_290._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_290._8_8_ = 0;
          local_228 = false;
          local_258._32_8_ = (pointer)0x0;
          aiStack_230 = (ios_base  [8])0x0;
          local_258._16_8_ = 0;
          local_258._24_8_ = (pointer)0x0;
          local_258._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_258._8_8_ = (_Base_ptr)0x0;
          local_1f0[0] = false;
          local_210._16_8_ = 0;
          local_210._24_8_ = (pointer)0x0;
          local_210._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_210._8_8_ = 0;
          local_1c8[0] = '\0';
          local_1f0._24_8_ = (pointer)0x0;
          local_1f0._32_8_ = 0;
          local_1f0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_1f0._16_8_ = 0;
          auStack_1b8[0x18] = '\0';
          auStack_1b8._8_8_ = 0;
          auStack_1b8._16_8_ = 0;
          local_1c8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          auStack_1b8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          auStack_170[8] = '\0';
          local_198._32_8_ = (pointer)0x0;
          auStack_170._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_198._16_8_ = 0;
          local_198._24_8_ = 0;
          local_198._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_198._8_8_ = 0;
          local_160[0x20] = false;
          local_160._16_8_ = 0;
          local_160._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_160._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_160[8] = false;
          local_160._9_3_ = 0;
          local_160._12_4_ = (storage_t<tinyusdz::Path::PathType>)0x0;
          local_138[0x20] = false;
          local_138[0x10] = false;
          local_138._17_3_ = 0;
          local_138._20_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
          local_138[0x18] = false;
          local_138._25_3_ = 0;
          local_138._28_4_ = (storage_t<unsigned_int>)0x0;
          local_138._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_138._8_8_ = 0;
          auStack_f8._32_8_ = (long)auStack_f8 + 0x10;
          sStack_c0._24_1_ = 0;
          sStack_c0._8_8_ = 0;
          sStack_c0._16_8_ = 0;
          auStack_f8._48_8_ = 0;
          sStack_c0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_a0[0x10] = false;
          stack0xffffffffffffff71 = 0;
          local_a0._0_8_ = (pointer)0x0;
          local_a0[8] = 0;
          local_a0._9_7_ = 0;
          uStack_40 = false;
          uStack_3f = 0;
          local_60._16_8_ = 0;
          local_60._24_1_ = 0;
          local_60._25_7_ = 0;
          local_60.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_60._8_8_ = 0;
          local_80._16_8_ = 0;
          local_80._24_8_ = 0;
          local_80._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_80._8_8_ = 0;
          local_2f0._0_8_ = local_2f0 + 0x10;
          auStack_f8._40_8_ = auStack_f8._32_8_;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_2f0,*(long *)(p_Var15 + 1),
                     (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
          prop = (Property *)local_4d0;
          local_4d0 = (undefined1  [8])auStack_4c0;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)prop,"inputs:varname","");
          target = (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)local_2b0;
          anon_unknown_0::ParseTypedAttribute<tinyusdz::Token>
                    ((ParseResult *)local_6e0,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_650,(string *)local_2f0,local_760,(string *)prop,target);
          if (local_4d0 != (undefined1  [8])auStack_4c0) {
            operator_delete((void *)local_4d0,(ulong)(auStack_4c0._0_8_ + 1));
          }
          if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
            operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
          }
          if (local_6e0._0_4_ == TypeMismatch) {
            local_310._0_8_ = local_300;
            ::std::__cxx11::string::_M_construct<char*>
                      (local_310,*(long *)(p_Var15 + 1),
                       (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
            prop = (Property *)local_4d0;
            local_4d0 = (undefined1  [8])auStack_4c0;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)prop,"inputs:varname","");
            pPVar18 = local_760;
            target = local_710;
            (anonymous_namespace)::ParseTypedAttribute<std::__cxx11::string>
                      ((ParseResult *)local_620,(_anonymous_namespace_ *)&local_650,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_310,(string *)local_760,prop,(string *)local_710,
                       in_stack_fffffffffffff868);
            if (local_4d0 != (undefined1  [8])auStack_4c0) {
              operator_delete((void *)local_4d0,(ulong)(auStack_4c0._0_8_ + 1));
            }
            if ((undefined8 *)local_310._0_8_ != local_300) {
              operator_delete((void *)local_310._0_8_,local_300[0] + 1);
            }
            if (local_620._0_4_ == Success) {
              iVar8 = 3;
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4d0);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d0,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4d0,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d0,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4d0,"ReconstructShader",0x11);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d0,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4d0,0x1223);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              local_788 = (undefined1  [8])&local_778;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_788,"Faied to parse inputs:varname: {}","");
              fmt::format<std::__cxx11::string>
                        ((string *)local_598,(fmt *)local_788,(string *)local_618,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar18);
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_4d0,(char *)local_598,local_590._0_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
              if (local_598 != (undefined1  [8])(local_598 + 0x10)) {
                operator_delete((void *)local_598,local_590._8_8_ + 1);
              }
              if (local_788 != (undefined1  [8])&local_778) {
                operator_delete((void *)local_788,(ulong)(local_778._M_allocated_capacity + 1));
              }
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar12 = (long *)::std::__cxx11::string::_M_append
                                            (local_788,(ulong)(err->_M_dataplus)._M_p);
                psVar2 = (size_type *)(plVar12 + 2);
                if ((size_type *)*plVar12 == psVar2) {
                  local_590._8_8_ = *psVar2;
                  local_590._16_8_ = plVar12[3];
                  local_598 = (undefined1  [8])(local_598 + 0x10);
                }
                else {
                  local_590._8_8_ = *psVar2;
                  local_598 = (undefined1  [8])*plVar12;
                }
                local_590._0_8_ = *(anon_struct_8_0_00000001_for___align *)(plVar12 + 1);
                *plVar12 = (long)psVar2;
                plVar12[1] = 0;
                *(undefined1 *)(plVar12 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)err,(string *)local_598);
                if (local_598 != (undefined1  [8])(local_598 + 0x10)) {
                  operator_delete((void *)local_598,local_590._8_8_ + 1);
                }
                if (local_788 != (undefined1  [8])&local_778) {
                  operator_delete((void *)local_788,(ulong)(local_778._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4d0);
              ::std::ios_base::~ios_base((ios_base *)&pSStack_460);
              iVar8 = 1;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_618._0_8_ != aaStack_608) {
              operator_delete((void *)local_618._0_8_,aaStack_608[0]._M_allocated_capacity + 1);
            }
          }
          else {
            iVar8 = 0;
            if (local_6e0._0_4_ == Success) {
              bVar32 = ConvertTokenAttributeToStringAttribute
                                 ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)
                                  local_2b0,
                                  (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_710);
              iVar8 = 3;
              if (!bVar32) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4d0);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4d0,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4d0,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d0,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4d0,"ReconstructShader",0x11);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d0,"():",3);
                poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4d0,0x1211);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4d0,
                           "Failed to convert inputs:varname token type to string type.",0x3b);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d0,"\n",1);
                if (err != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar12 = (long *)::std::__cxx11::string::_M_append
                                              (local_598,(ulong)(err->_M_dataplus)._M_p);
                  paVar16 = (anon_struct_8_0_00000001_for___align *)(plVar12 + 2);
                  if ((anon_struct_8_0_00000001_for___align *)*plVar12 == paVar16) {
                    local_618._8_8_ = *paVar16;
                    aaStack_608[0]._0_8_ = plVar12[3];
                    local_620 = (undefined1  [8])(local_618 + 8);
                  }
                  else {
                    local_618._8_8_ = *paVar16;
                    local_620 = (undefined1  [8])*plVar12;
                  }
                  local_618._0_8_ = *(anon_struct_8_0_00000001_for___align *)(plVar12 + 1);
                  *plVar12 = (long)paVar16;
                  plVar12[1] = 0;
                  *(undefined1 *)(plVar12 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)err,(string *)local_620);
                  if (local_620 != (undefined1  [8])(local_618 + 8)) {
                    operator_delete((void *)local_620,local_618._8_8_ + 1);
                  }
                  if (local_598 != (undefined1  [8])(local_598 + 0x10)) {
                    operator_delete((void *)local_598,local_590._8_8_ + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4d0);
                ::std::ios_base::~ios_base((ios_base *)&pSStack_460);
                iVar8 = 1;
              }
            }
          }
          if ((undefined1 *)local_6e0._8_8_ != local_6d0 + 8) {
            operator_delete((void *)local_6e0._8_8_,local_6d0._8_8_ + 1);
          }
          if (auStack_88[0] == '\x01') {
            nonstd::optional_lite::detail::storage_t<tinyusdz::Animatable<tinyusdz::Token>_>::
            destruct_value((storage_t<tinyusdz::Animatable<tinyusdz::Token>_> *)local_80);
          }
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_a0);
          AttrMetas::~AttrMetas((AttrMetas *)local_2b0);
          if (iVar8 != 0) goto LAB_00259138;
        }
        local_340._16_8_ = local_320;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_340 + 0x10),*(long *)(p_Var15 + 1),
                   (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
        local_788 = (undefined1  [8])&local_778;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"outputs:result","");
        uVar25 = local_340._24_8_;
        plVar12 = local_780;
        local_4c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (auStack_4c0 + 8);
        auStack_4c0._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
        ;
        auStack_4c0._8_8_ = auStack_4c0._8_8_ & 0xffffffffffffff00;
        __n_00 = (long *)local_340._24_8_;
        if (local_780 < (ulong)local_340._24_8_) {
          __n_00 = local_780;
        }
        if (__n_00 == (long *)0x0) {
          bVar32 = true;
        }
        else {
          iVar8 = bcmp((void *)local_340._16_8_,(void *)local_788,(size_t)__n_00);
          bVar32 = iVar8 == 0;
        }
        if ((bool)(bVar32 ^ 1U | (long *)uVar25 != plVar12)) {
          local_4d0._0_4_ = 1;
        }
        else {
          cVar13 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&local_650,(key_type *)local_788);
          if ((_Rb_tree_header *)cVar13._M_node == &local_650._M_impl.super__Rb_tree_header) {
            pPVar18 = prop;
            if ((*(uint *)((long)&p_Var15[0x17]._M_parent + 4) < 2) &&
               (bVar32 = Attribute::is_connection(&local_760->_attrib), pPVar18 = prop, bVar32)) {
              local_4d0._0_4_ = 5;
              prop = (Property *)0x38;
              ::std::__cxx11::string::_M_replace
                        ((ulong)&local_4c8,0,(char *)auStack_4c0._0_8_,0x3fbaed);
            }
            else if (*(int *)((long)&p_Var15[0x17]._M_parent + 4) == 0) {
              Attribute::type_name_abi_cxx11_((string *)local_2b0,&local_760->_attrib);
              bVar32 = tinyusdz::value::IsRoleType((string *)local_2b0);
              local_6d0._0_8_ = (pointer)0x643478697274616d;
              local_6e0._8_8_ = (pointer)0x8;
              local_6d0._8_8_ = local_6d0._8_8_ & 0xffffffffffffff00;
              local_6e0._0_8_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6d0;
              if ((local_2b0._8_8_ == 8) && (*(size_type *)local_2b0._0_8_ == 0x643478697274616d)) {
                (local_758->result)._authored = true;
LAB_002591a6:
                AttrMetas::operator=(local_720,(AttrMetas *)(p_Var15 + 7));
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_650,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_788);
                local_4d0 = (undefined1  [8])((ulong)local_4d0 & 0xffffffff00000000);
                prop = pPVar18;
              }
              else if (bVar32) {
                prop = (Property *)local_2b0;
                uVar9 = tinyusdz::value::GetUnderlyingTypeId((string *)prop);
                if (uVar9 == 0x38) {
                  (local_758->result)._authored = true;
                  ::std::__cxx11::string::_M_assign((string *)local_358);
                  goto LAB_002591a6;
                }
                local_4d0._0_4_ = 3;
                local_620 = (undefined1  [8])(local_618 + 8);
                local_598 = (undefined1  [8])0x61;
                paVar16 = (anon_struct_8_0_00000001_for___align *)
                          ::std::__cxx11::string::_M_create((ulong *)local_620,(ulong)local_598);
                auVar6 = local_598;
                local_618._8_8_ = local_598;
                local_620 = (undefined1  [8])paVar16;
                memcpy(paVar16,
                       "Attribute type mismatch. {} expects type `{}` but defined as type `{}`(and its underlying types)."
                       ,0x61);
                local_618._0_8_ = auVar6;
                *(char *)((long)auVar6 + (long)&paVar16->field_0x0) = '\0';
                local_598 = (undefined1  [8])(local_598 + 0x10);
                local_590._8_8_ = 0x643478697274616d;
                local_590._0_8_ = (anon_struct_8_0_00000001_for___align)0x8;
                local_590._16_8_ = local_590._16_8_ & 0xffffffffffffff00;
                fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                          ((string *)local_6e0,(fmt *)local_620,(string *)local_788,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_598,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prop
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            target);
                ::std::__cxx11::string::operator=((string *)&local_4c8,(string *)local_6e0);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_6e0._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6d0)
                {
                  operator_delete((void *)local_6e0._0_8_,(ulong)(local_6d0._0_8_ + 1));
                }
                if (local_598 != (undefined1  [8])(local_598 + 0x10)) {
                  operator_delete((void *)local_598,local_590._8_8_ + 1);
                }
                p_Var23 = local_718;
                err = local_750;
                if (local_620 != (undefined1  [8])(local_618 + 8)) {
                  operator_delete((void *)local_620,local_618._8_8_ + 1);
                  p_Var23 = local_718;
                  err = local_750;
                }
              }
              else {
                local_4d0._0_4_ = 3;
                local_598 = (undefined1  [8])0x46;
                local_620 = (undefined1  [8])(local_618 + 8);
                paVar16 = (anon_struct_8_0_00000001_for___align *)
                          ::std::__cxx11::string::_M_create((ulong *)local_620,(ulong)local_598);
                auVar6 = local_598;
                local_618._8_8_ = local_598;
                local_620 = (undefined1  [8])paVar16;
                memcpy(paVar16,
                       "Property type mismatch. {} expects type `{}` but defined as type `{}`.",0x46
                      );
                local_618._0_8_ = auVar6;
                *(char *)((long)auVar6 + (long)&paVar16->field_0x0) = '\0';
                local_598 = (undefined1  [8])(local_598 + 0x10);
                local_590._8_8_ = 0x643478697274616d;
                local_590._0_8_ = (anon_struct_8_0_00000001_for___align)0x8;
                local_590._16_8_ = local_590._16_8_ & 0xffffffffffffff00;
                prop = (Property *)local_2b0;
                fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                          ((string *)local_6e0,(fmt *)local_620,(string *)local_788,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_598,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prop
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            target);
                ::std::__cxx11::string::operator=((string *)&local_4c8,(string *)local_6e0);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_6e0._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6d0)
                {
                  operator_delete((void *)local_6e0._0_8_,(ulong)(local_6d0._0_8_ + 1));
                }
                if (local_598 != (undefined1  [8])(local_598 + 0x10)) {
                  operator_delete((void *)local_598,local_590._8_8_ + 1);
                }
                err = local_750;
                if (local_620 != (undefined1  [8])(local_618 + 8)) {
                  operator_delete((void *)local_620,local_618._8_8_ + 1);
                  err = local_750;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b0._0_8_ != &local_2a0) {
                operator_delete((void *)local_2b0._0_8_,local_2a0._M_allocated_capacity + 1);
              }
            }
            else {
              prop = (Property *)&DAT_00000041;
              ::std::__cxx11::string::_M_replace
                        ((ulong)&local_4c8,0,(char *)auStack_4c0._0_8_,0x3fbb26);
              local_4d0._0_4_ = 6;
            }
          }
          else {
            local_4d0._0_4_ = 2;
          }
        }
        if (local_788 != (undefined1  [8])&local_778) {
          operator_delete((void *)local_788,(ulong)(local_778._M_allocated_capacity + 1));
        }
        if ((long *)local_340._16_8_ != local_320) {
          operator_delete((void *)local_340._16_8_,local_320[0] + 1);
        }
        iVar8 = 0;
        if (((ulong)local_4d0 & 0xfffffffd) == 0) {
          iVar8 = 3;
LAB_00258cc7:
          bVar32 = false;
        }
        else {
          bVar32 = true;
          if (local_4d0._0_4_ != 1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
            poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2b0,0x1229);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
            local_620 = (undefined1  [8])(local_618 + 8);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_620,"Parsing shader output property `{}` failed. Error: {}",
                       "");
            fmt::format<char[15],std::__cxx11::string>
                      ((string *)local_6e0,(fmt *)local_620,(string *)"outputs:result",
                       (char (*) [15])&local_4c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prop);
            poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b0,(char *)local_6e0._0_8_,local_6e0._8_8_);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6e0._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6d0) {
              operator_delete((void *)local_6e0._0_8_,(ulong)(local_6d0._0_8_ + 1));
            }
            if (local_620 != (undefined1  [8])(local_618 + 8)) {
              operator_delete((void *)local_620,local_618._8_8_ + 1);
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar12 = (long *)::std::__cxx11::string::_M_append
                                          (local_620,(ulong)(err->_M_dataplus)._M_p);
              pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (plVar12 + 2);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar12 ==
                  pbVar3) {
                local_6d0._0_8_ = (pbVar3->_M_dataplus)._M_p;
                local_6d0._8_8_ = plVar12[3];
                local_6e0._0_8_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6d0;
              }
              else {
                local_6d0._0_8_ = (pbVar3->_M_dataplus)._M_p;
                local_6e0._0_8_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar12;
              }
              local_6e0._8_8_ = plVar12[1];
              *plVar12 = (long)pbVar3;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)err,(string *)local_6e0);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_6e0._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6d0) {
                operator_delete((void *)local_6e0._0_8_,(ulong)(local_6d0._0_8_ + 1));
              }
              if (local_620 != (undefined1  [8])(local_618 + 8)) {
                operator_delete((void *)local_620,local_618._8_8_ + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
            ::std::ios_base::~ios_base((ios_base *)(local_258 + 0x18));
            iVar8 = 1;
            goto LAB_00258cc7;
          }
        }
        if (local_4c8 !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(auStack_4c0 + 8))
        {
          operator_delete(local_4c8,auStack_4c0._8_8_ + 1);
        }
        __k = local_708;
        if (bVar32) {
          cVar13 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&local_650,(key_type *)local_708);
          p_Var4 = &local_650._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)cVar13._M_node == p_Var4) {
            pmVar14 = ::std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      ::operator[](local_348,(key_type *)__k);
            ::std::__cxx11::string::_M_assign((string *)pmVar14);
            (pmVar14->_attrib)._varying_authored = (bool)p_Var15[3].field_0x4;
            (pmVar14->_attrib)._variability = p_Var15[3]._M_color;
            ::std::__cxx11::string::_M_assign((string *)&(pmVar14->_attrib)._type_name);
            linb::any::operator=((any *)&(pmVar14->_attrib)._var,(any *)&p_Var15[4]._M_parent);
            (pmVar14->_attrib)._var._blocked = SUB41(p_Var15[5]._M_color,0);
            ::std::
            vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ::operator=(&(pmVar14->_attrib)._var._ts._samples,
                        (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                         *)&p_Var15[5]._M_parent);
            (pmVar14->_attrib)._var._ts._dirty = SUB41(p_Var15[6]._M_color,0);
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &(pmVar14->_attrib)._paths,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &p_Var15[6]._M_parent);
            AttrMetas::operator=(&(pmVar14->_attrib)._metas,(AttrMetas *)(p_Var15 + 7));
            *(_Base_ptr *)&pmVar14->_listOpQual = p_Var15[0x17]._M_parent;
            (pmVar14->_rel).type = *(Type *)&p_Var15[0x17]._M_left;
            Path::operator=(&(pmVar14->_rel).targetPath,(Path *)&p_Var15[0x17]._M_right);
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &(pmVar14->_rel).targetPathVector,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &p_Var15[0x1e]._M_parent);
            (pmVar14->_rel).listOpQual = p_Var15[0x1f]._M_color;
            AttrMetas::operator=(&(pmVar14->_rel)._metas,(AttrMetas *)&p_Var15[0x1f]._M_parent);
            (pmVar14->_rel)._varying_authored = *(bool *)&p_Var15[0x2f]._M_left;
            ::std::__cxx11::string::_M_assign((string *)&pmVar14->_prop_value_type_name);
            __k = local_708;
            pmVar14->_has_custom = *(bool *)&p_Var15[0x30]._M_right;
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_650,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_708);
          }
          cVar13 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&local_650,(key_type *)__k);
          iVar8 = 0;
          if ((_Rb_tree_header *)cVar13._M_node == p_Var4) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[warn]",6);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
            poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2b0,0x122b);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_4d0,"Unsupported/unimplemented property: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __k);
            poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b0,(char *)local_4d0,(long)local_4c8);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
            if (local_4d0 != (undefined1  [8])auStack_4c0) {
              operator_delete((void *)local_4d0,(ulong)(auStack_4c0._0_8_ + 1));
            }
            uVar25 = local_340._0_8_;
            if ((anon_struct_8_0_00000001_for___align)local_340._0_8_ !=
                (anon_struct_8_0_00000001_for___align)0x0) {
              ::std::__cxx11::stringbuf::str();
              puVar11 = (undefined8 *)
                        ::std::__cxx11::string::_M_append(local_6e0,(ulong)(err->_M_dataplus)._M_p);
              pcVar1 = (char *)(puVar11 + 2);
              if ((char *)*puVar11 == pcVar1) {
                auStack_4c0._0_8_ = *(undefined8 *)pcVar1;
                auStack_4c0._8_8_ = puVar11[3];
                local_4d0 = (undefined1  [8])auStack_4c0;
              }
              else {
                auStack_4c0._0_8_ = *(undefined8 *)pcVar1;
                local_4d0 = (undefined1  [8])*puVar11;
              }
              local_4c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          puVar11[1];
              *puVar11 = pcVar1;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)uVar25,(string *)local_4d0);
              if (local_4d0 != (undefined1  [8])auStack_4c0) {
                operator_delete((void *)local_4d0,(ulong)(auStack_4c0._0_8_ + 1));
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_6e0._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6d0) {
                operator_delete((void *)local_6e0._0_8_,(ulong)(local_6d0._0_8_ + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
            ::std::ios_base::~ios_base((ios_base *)(local_258 + 0x18));
          }
        }
      }
LAB_00259138:
      if ((iVar8 != 3) && (iVar8 != 0)) break;
      p_Var15 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var15);
      local_789 = p_Var15 == p_Var23;
    } while (!local_789);
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_650,(_Link_type)local_650._M_impl.super__Rb_tree_header._M_header._M_parent);
  return local_789;
}

Assistant:

bool ReconstructShader<UsdPrimvarReader_matrix>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdPrimvarReader_matrix *preader,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>

  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:fallback", UsdPrimvarReader_matrix,
                   preader->fallback)
    if ((prop.first == kInputsVarname) && !table.count(kInputsVarname)) {
      // Support older spec: `token` for varname
      TypedAttribute<Animatable<value::token>> tok_attr;
      auto ret = ParseTypedAttribute(table, prop.first, prop.second, kInputsVarname, tok_attr);
      if (ret.code == ParseResult::ResultCode::Success) {
        if (!ConvertTokenAttributeToStringAttribute(tok_attr, preader->varname)) {
          PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname token type to string type.");
        }
        DCOUT("`token` attribute is converted to `string` attribute.");
        continue;
      } else if (ret.code == ParseResult::ResultCode::TypeMismatch) {
        //TypedAttribute<Animatable<value::StringData>> sdata_attr;
        //auto sdret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", sdata_attr);
        //if (sdret.code == ParseResult::ResultCode::Success) {
        //  if (!ConvertStringDataAttributeToStringAttribute(sdata_attr, preader->varname)) {
        //    PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname StringData type to string type.");
        //  }
        //} else if (sdret.code == ParseResult::ResultCode::TypeMismatch) {
          auto sret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", preader->varname);
          if (sret.code == ParseResult::ResultCode::Success) {
            DCOUT("Parsed string typed inputs:varname.");
            // ok
            continue;
          } else {
            PUSH_ERROR_AND_RETURN(fmt::format("Faied to parse inputs:varname: {}", sret.err));
          }
        //}
      }
    }
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:result",
                                  UsdPrimvarReader_matrix, preader->result)
    ADD_PROPERTY(table, prop, UsdPrimvarReader_matrix, preader->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }
  return true;
}